

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_gej_eq_x_var(secp256k1_fe *x,secp256k1_gej *a)

{
  int iVar1;
  undefined1 local_68 [8];
  secp256k1_fe r2;
  secp256k1_fe r;
  secp256k1_gej *a_local;
  secp256k1_fe *x_local;
  
  secp256k1_fe_sqr((secp256k1_fe *)(r2.n + 4),&a->z);
  secp256k1_fe_mul((secp256k1_fe *)(r2.n + 4),(secp256k1_fe *)(r2.n + 4),x);
  memcpy(local_68,a,0x28);
  secp256k1_fe_normalize_weak((secp256k1_fe *)local_68);
  iVar1 = secp256k1_fe_equal_var((secp256k1_fe *)(r2.n + 4),(secp256k1_fe *)local_68);
  return iVar1;
}

Assistant:

static int secp256k1_gej_eq_x_var(const secp256k1_fe *x, const secp256k1_gej *a) {
    secp256k1_fe r, r2;
    VERIFY_CHECK(!a->infinity);
    secp256k1_fe_sqr(&r, &a->z); secp256k1_fe_mul(&r, &r, x);
    r2 = a->x; secp256k1_fe_normalize_weak(&r2);
    return secp256k1_fe_equal_var(&r, &r2);
}